

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> * __thiscall
draco::Decoder::DecodePointCloudFromBuffer(Decoder *this,DecoderBuffer *in_buffer)

{
  bool bVar1;
  EncodedGeometryType *pEVar2;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *in_RDI;
  Status _local_status_1;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  Status _local_status;
  unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> point_cloud;
  EncodedGeometryType type;
  Status _status;
  StatusOr<draco::EncodedGeometryType> _statusor69;
  undefined4 in_stack_fffffffffffffe38;
  Code in_stack_fffffffffffffe3c;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
  *in_stack_fffffffffffffe40;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *this_00;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  Mesh *in_stack_fffffffffffffe78;
  DecoderBuffer *in_stack_fffffffffffffe80;
  Decoder *in_stack_fffffffffffffe88;
  undefined1 local_139 [73];
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> local_f0 [3];
  DecoderBuffer *in_stack_ffffffffffffff28;
  PointCloud *in_stack_ffffffffffffff48;
  DecoderBuffer *in_stack_ffffffffffffff50;
  Decoder *in_stack_ffffffffffffff58;
  StatusOr<draco::EncodedGeometryType> local_48;
  
  GetEncodedGeometryType(in_stack_ffffffffffffff28);
  bVar1 = StatusOr<draco::EncodedGeometryType>::ok((StatusOr<draco::EncodedGeometryType> *)0x14d3b3)
  ;
  if (bVar1) {
    pEVar2 = StatusOr<draco::EncodedGeometryType>::value(&local_48);
    if (*pEVar2 == POINT_CLOUD) {
      operator_new(0xa8);
      PointCloud::PointCloud
                ((PointCloud *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::
      unique_ptr<std::default_delete<draco::PointCloud>,void>
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffe40,
                 (pointer)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::get
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffe40);
      DecodeBufferToGeometry
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      bVar1 = Status::ok((Status *)&stack0xffffffffffffff48);
      if (!bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(in_stack_fffffffffffffe40,
                 (Status *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      Status::~Status((Status *)0x14d5b7);
      if (bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(in_stack_fffffffffffffe40,
                 (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::~unique_ptr
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffe40);
    }
    else if (*pEVar2 == TRIANGULAR_MESH) {
      operator_new(0xd8);
      Mesh::Mesh((Mesh *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
      unique_ptr<std::default_delete<draco::Mesh>,void>
                ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 in_stack_fffffffffffffe40,
                 (pointer)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
                ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 in_stack_fffffffffffffe40);
      DecodeBufferToGeometry
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      bVar1 = Status::ok((Status *)(local_f0 + 1));
      uVar3 = bVar1;
      if (!bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(in_stack_fffffffffffffe40,
                 (Status *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      Status::~Status((Status *)0x14d73d);
      if (bVar1) {
        std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::
        unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>,void>
                  ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffe50),local_f0);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(in_stack_fffffffffffffe40,
                 (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::~unique_ptr
                  ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                   in_stack_fffffffffffffe40);
      }
      std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
                ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 in_stack_fffffffffffffe40);
    }
    else {
      this_00 = (StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                 *)local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      Status::Status(&this_00->status_,in_stack_fffffffffffffe3c,(string *)0x14d81f);
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr(this_00,(Status *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      Status::~Status((Status *)0x14d842);
      std::__cxx11::string::~string((string *)(local_139 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_139);
    }
  }
  else {
    StatusOr<draco::EncodedGeometryType>::status(&local_48);
    Status::Status(&in_stack_fffffffffffffe40->status_,
                   (Status *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::StatusOr
              (in_stack_fffffffffffffe40,
               (Status *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    Status::~Status((Status *)0x14d421);
  }
  StatusOr<draco::EncodedGeometryType>::~StatusOr((StatusOr<draco::EncodedGeometryType> *)0x14d8df);
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> Decoder::DecodePointCloudFromBuffer(
    DecoderBuffer *in_buffer) {
  DRACO_ASSIGN_OR_RETURN(EncodedGeometryType type,
                         GetEncodedGeometryType(in_buffer))
  if (type == POINT_CLOUD) {
#ifdef DRACO_POINT_CLOUD_COMPRESSION_SUPPORTED
    std::unique_ptr<PointCloud> point_cloud(new PointCloud());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, point_cloud.get()))
    return std::move(point_cloud);
#endif
  } else if (type == TRIANGULAR_MESH) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
    std::unique_ptr<Mesh> mesh(new Mesh());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
    return static_cast<std::unique_ptr<PointCloud>>(std::move(mesh));
#endif
  }
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
}